

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

void __thiscall
tsbp::LeftmostActiveOnly::DomainReductionY(LeftmostActiveOnly *this,size_t domainReducedItemIndex)

{
  int iVar1;
  pointer pRVar2;
  pointer __s;
  pointer puVar3;
  bool bVar4;
  reference pvVar5;
  int iVar6;
  size_t j;
  pointer pRVar7;
  size_type pos;
  size_t sVar8;
  double dVar9;
  allocator<unsigned_long> local_71;
  vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
  *local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  local_70 = (vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
              *)&this->itemSpecificPlacementPointsY;
  local_68 = domainReducedItemIndex;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::reserve((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_70,
            (long)(this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5);
  sVar8 = local_68;
  pRVar7 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar7) {
    iVar1 = (this->container).super_Rectangle.Dx;
    pRVar2 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar9 = floor((double)((this->container).super_Rectangle.Dy - pRVar2[local_68].Dy) * 0.5);
    iVar6 = (int)dVar9;
    dVar9 = floor((double)(iVar1 - pRVar2[sVar8].Dx) * 0.5);
    local_58 = (size_t)(int)dVar9;
    local_60 = (size_t)((iVar6 + 1) * ((int)dVar9 + 1));
    sVar8 = 0;
    do {
      if (sVar8 != (long)pRVar7[sVar8].InternId) {
        __assert_fail("item.InternId == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/tsbp/src/BranchAndBound.cpp"
                      ,0x83,"void tsbp::LeftmostActiveOnly::DomainReductionY(const size_t)");
      }
      if (sVar8 == local_68) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (&local_50,(long)(this->container).super_Rectangle.Dy,0,&local_71);
        pvVar5 = std::
                 vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                 ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                           (local_70,&local_50);
        bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_50);
        if (!bVar4) {
LAB_0014499e:
          __assert_fail("m_check_invariants()",
                        "/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                        "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                       );
        }
        if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        __s = (pvVar5->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (pvVar5->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (__s != puVar3) {
          memset(__s,0,(long)puVar3 - (long)__s & 0xfffffffffffffff8);
        }
        pos = 0;
        do {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar5,pos,true)
          ;
          pos = pos + 1;
        } while (pos <= (ulong)(long)iVar6);
        this->reducedItemDomainX = local_58;
        this->reducedItemDomainY = (long)iVar6;
        this->reducedItemFeasiblePlacementPoints = local_60;
      }
      else {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (&local_50,(long)(this->container).super_Rectangle.Dy,0,&local_71);
        pvVar5 = std::
                 vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                 ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                           (local_70,&local_50);
        bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_50);
        if (!bVar4) goto LAB_0014499e;
        if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar5);
      }
      sVar8 = sVar8 + 1;
      pRVar7 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (sVar8 < (ulong)((long)(this->items).
                                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar7 >> 5));
  }
  return;
}

Assistant:

void LeftmostActiveOnly::DomainReductionY(const size_t domainReducedItemIndex)
{
    itemSpecificPlacementPointsY.reserve(this->items.size());

    int reducedDomainThresholdX = std::floor((this->container.Dx - this->items[domainReducedItemIndex].Dx) / 2.0);
    int reducedDomainThresholdY = std::floor((this->container.Dy - this->items[domainReducedItemIndex].Dy) / 2.0);

    for (size_t i = 0; i < this->items.size(); i++)
    {
        const Rectangle& item = this->items[i];
        assert(item.InternId == i);

        if (i == domainReducedItemIndex)
        {
            auto& bitsetY = this->itemSpecificPlacementPointsY.emplace_back(boost::dynamic_bitset<>(this->container.Dy));
            bitsetY.reset();

            for (size_t j = 0; j <= reducedDomainThresholdY; j++)
            {
                bitsetY.set(j);
            }

            this->reducedItemDomainX = reducedDomainThresholdX;
            this->reducedItemDomainY = reducedDomainThresholdY;
            this->reducedItemFeasiblePlacementPoints = (reducedDomainThresholdX + 1) * (reducedDomainThresholdY + 1);

            continue;
        }

        // TODO: reduce by item.Dy to exclude overlap with the container. Enables simplification of no-overlap checks.
        auto& bitsetY = this->itemSpecificPlacementPointsY.emplace_back(boost::dynamic_bitset<>(this->container.Dy));
        bitsetY.set();
    }
}